

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O3

pair<unsigned_long,_llvm::dwarf::Tag> __thiscall
llvm::AppleAcceleratorTable::readAtoms(AppleAcceleratorTable *this,uint64_t *HashDataOffset)

{
  short *psVar1;
  short sVar2;
  ulong uVar3;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar4;
  FormParams FP;
  short *psVar5;
  OptionalStorage<unsigned_long,_true> OVar6;
  pair<unsigned_long,_llvm::dwarf::Tag> pVar7;
  undefined1 local_78 [8];
  DWARFFormValue FormValue;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_38;
  
  local_38.value = 0xffffffff;
  uVar3 = (ulong)(this->HdrData).Atoms.
                 super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
                 super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
                 super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                 .super_SmallVectorBase.Size;
  if (uVar3 == 0) {
    aVar4.value = 0;
  }
  else {
    psVar5 = (short *)(this->HdrData).Atoms.
                      super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
                      super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>
                      .
                      super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                      .super_SmallVectorBase.BeginX;
    psVar1 = psVar5 + uVar3 * 2;
    FP.AddrSize = '\0';
    FP.Format = DWARF32;
    FP.Version = (this->Hdr).Version;
    aVar4.value = 0;
    FormValue.C = (DWARFContext *)HashDataOffset;
    do {
      sVar2 = *psVar5;
      local_78._0_2_ = psVar5[1];
      FormValue.Form = 0;
      FormValue._2_6_ = 0;
      FormValue.Value.field_0.uval = 0;
      FormValue.Value.SectionIndex = 0;
      FormValue.U = (DWARFUnit *)0x0;
      DWARFFormValue::extractValue
                ((DWARFFormValue *)local_78,&(this->super_DWARFAcceleratorTable).AccelSection,
                 (uint64_t *)FormValue.C,FP,(DWARFContext *)0x0,(DWARFUnit *)0x0);
      if (sVar2 == 3) {
        OVar6 = (OptionalStorage<unsigned_long,_true>)
                DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_78);
        aVar4 = OVar6.field_0;
joined_r0x00d488ab:
        if (((undefined1  [16])OVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          __assert_fail("hasVal",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                        ,0xad,
                        "T &llvm::optional_detail::OptionalStorage<unsigned long>::getValue() & [T = unsigned long]"
                       );
        }
      }
      else if (sVar2 == 1) {
        OVar6 = (OptionalStorage<unsigned_long,_true>)
                DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_78);
        local_38 = OVar6.field_0;
        goto joined_r0x00d488ab;
      }
      psVar5 = psVar5 + 2;
    } while (psVar5 != psVar1);
  }
  pVar7._8_8_ = aVar4.value & 0xffffffff;
  pVar7.first = local_38.value;
  return pVar7;
}

Assistant:

std::pair<uint64_t, dwarf::Tag>
AppleAcceleratorTable::readAtoms(uint64_t *HashDataOffset) {
  uint64_t DieOffset = dwarf::DW_INVALID_OFFSET;
  dwarf::Tag DieTag = dwarf::DW_TAG_null;
  dwarf::FormParams FormParams = {Hdr.Version, 0, dwarf::DwarfFormat::DWARF32};

  for (auto Atom : getAtomsDesc()) {
    DWARFFormValue FormValue(Atom.second);
    FormValue.extractValue(AccelSection, HashDataOffset, FormParams);
    switch (Atom.first) {
    case dwarf::DW_ATOM_die_offset:
      DieOffset = *FormValue.getAsUnsignedConstant();
      break;
    case dwarf::DW_ATOM_die_tag:
      DieTag = (dwarf::Tag)*FormValue.getAsUnsignedConstant();
      break;
    default:
      break;
    }
  }
  return {DieOffset, DieTag};
}